

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O3

void NULLC::CopyArray(NULLCAutoArray *dst,NULLCAutoArray src)

{
  char *__dest;
  
  if (dst == (NULLCAutoArray *)0x0) {
    nullcThrowError("ERROR: null pointer access");
    return;
  }
  dst->typeID = src.typeID;
  dst->len = src.len;
  if (src.typeID < *(uint *)(linker + 0x20c)) {
    __dest = (char *)AllocObject(*(int *)(*(long *)(linker + 0x200) + 4 + (ulong)src.typeID * 0x50)
                                 * src.len,src.typeID);
    dst->ptr = __dest;
    if (src.len == 0) {
      return;
    }
    if (src.typeID < *(uint *)(linker + 0x20c)) {
      memcpy(__dest,src.ptr,
             (ulong)(src.len * *(int *)(*(long *)(linker + 0x200) + 4 + (ulong)src.typeID * 0x50)));
      return;
    }
  }
  __assert_fail("index < count",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x7f,
                "T &FastVector<ExternTypeInfo>::operator[](unsigned int) [T = ExternTypeInfo, zeroNewMemory = false, skipConstructor = false]"
               );
}

Assistant:

void NULLC::CopyArray(NULLCAutoArray* dst, NULLCAutoArray src)
{
	if(!dst)
	{
		nullcThrowError("ERROR: null pointer access");
		return;
	}
	dst->typeID = src.typeID;
	dst->len = src.len;
	dst->ptr = (char*)NULLC::AllocObject(src.len * linker->exTypes[src.typeID].size, src.typeID);

	if(src.len)
		memcpy(dst->ptr, src.ptr, unsigned(src.len * linker->exTypes[src.typeID].size));
}